

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_t.cpp
# Opt level: O3

void __thiscall deci::array_t::Append(array_t *this,value_t *el)

{
  pointer *pppvVar1;
  iterator __position;
  int iVar2;
  undefined4 extraout_var;
  value_t *local_10;
  
  iVar2 = (*el->_vptr_value_t[2])(el);
  local_10 = (value_t *)CONCAT44(extraout_var,iVar2);
  __position._M_current =
       (this->elements).super__Vector_base<deci::value_t_*,_std::allocator<deci::value_t_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->elements).super__Vector_base<deci::value_t_*,_std::allocator<deci::value_t_*>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage) {
    std::vector<deci::value_t*,std::allocator<deci::value_t*>>::_M_realloc_insert<deci::value_t*>
              ((vector<deci::value_t*,std::allocator<deci::value_t*>> *)&this->elements,__position,
               &local_10);
  }
  else {
    *__position._M_current = local_10;
    pppvVar1 = &(this->elements).
                super__Vector_base<deci::value_t_*,_std::allocator<deci::value_t_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppvVar1 = *pppvVar1 + 1;
  }
  return;
}

Assistant:

void array_t::Append(const value_t& el) {
      this->elements.push_back(el.Copy());
    }